

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O0

void __thiscall boost::unit_test::decorator::description::~description(description *this)

{
  void *in_RDI;
  
  ~description((description *)0x248258);
  operator_delete(in_RDI,0x18);
  return;
}

Assistant:

class BOOST_TEST_DECL description : public decorator::base {
public:
    explicit                description( const_string descr ) : m_description( descr ) {}

private:
    // decorator::base interface
    virtual void            apply( test_unit& tu );
    virtual base_ptr        clone() const { return base_ptr(new description( m_description )); }

    // Data members
    const_string            m_description;
}